

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles2::Functional::ShaderSourceReplaceCase::generateSecondSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderSourceReplaceCase *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1bb6ea2);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->m_shaderType == SHADERTYPE_FRAGMENT) || (this->m_shaderType == SHADERTYPE_VERTEX)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string generateSecondSource (void)
	{
		std::string str;

		str  = "#version 100\n";
		str += "precision highp float;\n\n";

		str += "void main()\n";
		str += "{\n";
		str += "	float variable = 1.0;\n";

		if		(m_shaderType == glu::SHADERTYPE_VERTEX)	str += "	gl_Position = vec4(variable);\n";
		else if	(m_shaderType == glu::SHADERTYPE_FRAGMENT)	str += "	gl_FragColor = vec4(variable);\n";

		str += "}\n";

		return str;
	}